

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  uint3 uVar6;
  byte bVar7;
  ImGuiContext *pIVar8;
  undefined1 auVar9 [16];
  char *pcVar10;
  bool bVar11;
  undefined1 uVar12;
  bool bVar13;
  ImU32 id;
  uint uVar14;
  int iVar15;
  int iVar16;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ImGuiCol idx;
  long lVar24;
  ImGuiTabItem *pIVar25;
  int iVar26;
  uint flags_00;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar28;
  bool text_clipped;
  bool just_closed;
  ImGuiContext *local_b0;
  ImRect bb;
  bool held;
  float local_6c;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool *local_50;
  bool hovered;
  float fStack_44;
  int local_40;
  int local_3c;
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return false;
  }
  local_50 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_50 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar5 = TabItemCalcSize(label,local_50 != (bool *)0x0);
  local_68._0_4_ = IVar5.x;
  local_68._4_4_ = IVar5.y;
  uVar14 = (tab_bar->Tabs).Size;
  uStack_60 = extraout_XMM0_Dc;
  uStack_5c = extraout_XMM0_Dd;
  local_38 = label;
  if (0 < (int)uVar14 && id != 0) {
    pIVar17 = (tab_bar->Tabs).Data;
    lVar24 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar17->ID + lVar24) == id) {
        pIVar25 = (ImGuiTabItem *)((long)&pIVar17->ID + lVar24);
        bVar7 = 0;
        goto LAB_0016da65;
      }
      lVar24 = lVar24 + 0x28;
    } while ((ulong)uVar14 * 0x28 != lVar24);
  }
  if (uVar14 == (tab_bar->Tabs).Capacity) {
    local_68._0_4_ = IVar5.x;
    local_68._4_4_ = IVar5.y;
    if (uVar14 == 0) {
      iVar20 = 8;
    }
    else {
      iVar20 = (int)uVar14 / 2 + uVar14;
    }
    iVar21 = uVar14 + 1;
    if ((int)(uVar14 + 1) < iVar20) {
      iVar21 = iVar20;
    }
    pIVar17 = (ImGuiTabItem *)MemAlloc((long)iVar21 * 0x28);
    pIVar25 = (tab_bar->Tabs).Data;
    if (pIVar25 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar17,pIVar25,(long)(tab_bar->Tabs).Size * 0x28);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar17;
    (tab_bar->Tabs).Capacity = iVar21;
    uVar14 = (tab_bar->Tabs).Size;
  }
  else {
    pIVar17 = (tab_bar->Tabs).Data;
  }
  pIVar17[(int)uVar14].ID = 0;
  pIVar17[(int)uVar14].Flags = 0;
  pIVar17[(int)uVar14].LastFrameVisible = -1;
  pIVar17[(int)uVar14].LastFrameSelected = -1;
  pIVar17[(int)uVar14].Offset = 0.0;
  pIVar17[(int)uVar14].Width = 0.0;
  pIVar17[(int)uVar14].ContentWidth = 0.0;
  pIVar25 = pIVar17 + (int)uVar14;
  pIVar25->NameOffset = -1;
  pIVar25->BeginOrder = -1;
  pIVar25->IndexDuringLayout = -1;
  *(undefined4 *)&pIVar17[(int)uVar14].WantClose = 0;
  iVar20 = (tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = iVar20 + 1;
  pIVar17 = (tab_bar->Tabs).Data;
  pIVar25 = pIVar17 + iVar20;
  pIVar25->ID = id;
  pIVar17[iVar20].Width = (float)local_68._0_4_;
  tab_bar->TabsAddedNew = true;
  bVar7 = 1;
LAB_0016da65:
  pcVar10 = local_38;
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar25 - (int)pIVar17) >> 3) * -0x3333;
  pIVar25->ContentWidth = (float)local_68._0_4_;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar25->BeginOrder = sVar3;
  uVar14 = tab_bar->Flags;
  iVar15 = tab_bar->PrevFrameVisible + 1;
  local_b0 = pIVar8;
  iVar20 = pIVar8->FrameCount;
  iVar26 = pIVar25->LastFrameVisible + 1;
  pIVar25->LastFrameVisible = iVar20;
  pIVar25->Flags = flags_00;
  iVar21 = (tab_bar->TabsNames).Buf.Size;
  iVar16 = iVar21 + -1;
  if (iVar21 == 0) {
    iVar16 = 0;
  }
  pIVar25->NameOffset = iVar16;
  sVar18 = strlen(local_38);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar10,pcVar10 + sVar18 + 1);
  if (((iVar26 < iVar20) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar15 < iVar20) {
      if ((flags_00 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0016db4f;
    }
    else if ((flags_00 >> 0x15 & 1) == 0) {
LAB_0016db4f:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar6 = (uint3)(flags_00 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar23 = CONCAT71((uint7)uVar6,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar15 < iVar20) && ((tab_bar->Tabs).Size == 1)) {
    uVar23 = (ulong)CONCAT31(uVar6,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar23 = 0;
  }
  if ((bool)((bVar7 | iVar20 <= iVar15) & iVar26 < iVar20)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & (byte)uVar23);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar25->LastFrameSelected = local_b0->FrameCount;
  }
  uVar22 = pIVar25->Flags;
  fVar2 = pIVar25->Width;
  fVar27 = pIVar25->Offset;
  if ((uVar22 & 0xc0) == 0) {
    fVar27 = (float)(int)(fVar27 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar27 + (tab_bar->BarRect).Min.x;
  IVar5 = (pIVar4->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar28.y = bb.Min.y;
  IVar28.x = bb.Min.x;
  (pIVar4->DC).CursorPos = IVar28;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)local_68._4_4_ + bb.Min.y;
  local_68 = (undefined1  [8])uVar23;
  local_40 = iVar26;
  local_3c = iVar20;
  if ((uVar22 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0016dca6;
    fStack_44 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    bVar13 = true;
  }
  else {
LAB_0016dca6:
    bVar13 = false;
  }
  pIVar8 = local_b0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_44 = bb.Max.y - bb.Min.y;
  IVar28 = (pIVar4->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_b0->Style).FramePadding.y);
  (pIVar4->DC).CursorMaxPos = IVar28;
  bVar11 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar11) {
    uVar12 = local_68[0];
    if (bVar13) {
      PopClipRect();
    }
    (pIVar4->DC).CursorPos = IVar5;
    return (bool)uVar12;
  }
  uVar22 = flags_00 & 0x200000;
  uVar12 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar22 >> 0x11) + (uint)pIVar8->DragDropActive * 0x200 + 0x1010);
  auVar9 = _local_68;
  if (((bool)uVar12) && (uVar22 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (local_b0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_3c <= local_40)) && (bVar11 = IsMouseDragging(0,-1.0), bVar11)) &&
      ((local_b0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_b0->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_b0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_b0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar25,(local_b0->IO).MousePos);
  }
  draw_list = pIVar4->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (auVar9[0] == '\0') {
      idx = (uint)((uVar14 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar14 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar11 = IsItemHovered(0x20);
  if (bVar11) {
    bVar11 = IsMouseClicked(1,false);
    if (bVar11) {
      uVar22 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar11 = IsMouseReleased(1);
      if (!bVar11) goto LAB_0016df54;
    }
    if (uVar22 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0016df54:
  uVar14 = tab_bar->Flags;
  if (local_50 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  pcVar10 = local_38;
  bVar11 = local_68[0];
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar14 >> 1 & 4 | flags_00,tab_bar->FramePadding,local_38,id,
             close_button_id,local_68[0],&just_closed,&text_clipped);
  if ((local_50 != (bool *)0x0) && (just_closed != false)) {
    *local_50 = false;
    if ((pIVar25->Flags & 1) == 0) {
      pIVar25->WantClose = true;
      if (tab_bar->VisibleTabId == pIVar25->ID) {
        pIVar25->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != pIVar25->ID) {
      tab_bar->NextSelectedTabId = pIVar25->ID;
    }
  }
  if (bVar13) {
    PopClipRect();
  }
  (pIVar4->DC).CursorPos = IVar5;
  if ((((text_clipped == true) && (local_b0->HoveredId == id)) && (held == false)) &&
     (((local_b0->TooltipSlowDelay <= local_b0->HoveredIdNotActiveTimer &&
        local_b0->HoveredIdNotActiveTimer != local_b0->TooltipSlowDelay &&
       (bVar13 = IsItemHovered(0), bVar13)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar25->Flags & 0x10) == 0)))))) {
    pcVar19 = FindRenderedTextEnd(pcVar10,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)pcVar10),pcVar10);
  }
  if ((flags_00 >> 0x15 & 1) == 0) {
    uVar12 = bVar11;
  }
  return (bool)uVar12;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}